

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O1

_Bool tval_is_useable(object *obj)

{
  return (_Bool)((byte)(0x37c00000 >> (obj->tval & 0x1f)) & obj->tval < 0x1e);
}

Assistant:

bool tval_is_useable(const struct object *obj)
{
	switch (obj->tval) {
		case TV_ROD:
		case TV_WAND:
		case TV_STAFF:
		case TV_SCROLL:
		case TV_POTION:
		case TV_FOOD:
		case TV_MUSHROOM:
			return true;
		default:
			return false;
	}
}